

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::WriteUnbuffered
          (PosixWritableFile *this,char *data,size_t size)

{
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t in_RCX;
  
  do {
    if (in_RCX == 0) {
      (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
      return (Status)(char *)this;
    }
    sVar2 = write(*(int *)(data + 0x10010),(void *)size,in_RCX);
    if (sVar2 < 0) {
      piVar3 = __errno_location();
      if (*piVar3 == 4) goto LAB_0010be95;
      PosixError((anon_unknown_1 *)this,(string *)(data + 0x10018),*piVar3);
      bVar1 = true;
    }
    else {
      size = size + sVar2;
      in_RCX = in_RCX - sVar2;
LAB_0010be95:
      bVar1 = false;
    }
    if (bVar1) {
      return (Status)(char *)this;
    }
  } while( true );
}

Assistant:

Status WriteUnbuffered(const char* data, size_t size) {
    while (size > 0) {
      ssize_t write_result = ::write(fd_, data, size);
      if (write_result < 0) {
        if (errno == EINTR) {
          continue;  // Retry
        }
        return PosixError(filename_, errno);
      }
      data += write_result;
      size -= write_result;
    }
    return Status::OK();
  }